

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O1

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
::Double(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
         *this,double d)

{
  Stack<rapidjson::CrtAllocator> *this_00;
  char *pcVar1;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *pGVar2;
  char *pcVar3;
  char *pcVar4;
  double value;
  int K;
  int length;
  int local_40;
  int local_3c;
  double local_38;
  
  local_38 = d;
  Prefix(this,kNumberType);
  this_00 = &this->os_->stack_;
  if (this_00->stackEnd_ <= this_00->stackTop_ + 0x19) {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,0x19);
  }
  pcVar1 = this_00->stackTop_;
  this_00->stackTop_ = pcVar1 + 0x19;
  if ((local_38 != 0.0) || (NAN(local_38))) {
    pcVar4 = pcVar1;
    value = local_38;
    if (local_38 < 0.0) {
      *pcVar1 = '-';
      pcVar4 = pcVar1 + 1;
      value = -local_38;
    }
    internal::Grisu2(value,pcVar4,&local_3c,&local_40);
    pcVar4 = internal::Prettify(pcVar4,local_3c,local_40);
  }
  else {
    pcVar4 = pcVar1;
    if ((long)local_38 < 0) {
      pcVar4 = pcVar1 + 1;
      *pcVar1 = '-';
    }
    pcVar4[0] = '0';
    pcVar4[1] = '.';
    pcVar4[2] = '0';
    pcVar4 = pcVar4 + 3;
  }
  pGVar2 = this->os_;
  pcVar3 = (pGVar2->stack_).stackTop_;
  if ((ulong)((long)pcVar3 - (long)(pGVar2->stack_).stack_) < ((long)pcVar1 - (long)pcVar4) + 0x19U)
  {
    __assert_fail("GetSize() >= count * sizeof(T)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ntrrgc[P]pulse-volume-monitor/vendor/rapidjson/internal/stack.h"
                  ,0x71,
                  "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Pop(size_t) [Allocator = rapidjson::CrtAllocator, T = char]"
                 );
  }
  (pGVar2->stack_).stackTop_ = pcVar3 + (-0x19 - ((long)pcVar1 - (long)pcVar4));
  return true;
}

Assistant:

bool Double(double d)       { Prefix(kNumberType); return WriteDouble(d); }